

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen10CachePolicy.cpp
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmGen10CachePolicy::BestMatchingPATIdx
          (GmmGen10CachePolicy *this,GMM_CACHE_POLICY_ELEMENT CachePolicy)

{
  uint uVar1;
  GMM_CACHE_POLICY_ELEMENT CachePolicy_00;
  undefined1 auVar2 [32];
  uint32_t uVar3;
  bool bVar4;
  GMM_GFX_MEMORY_TYPE WantedMT;
  GMM_GFX_TARGET_CACHE WantedTC;
  GMM_PRIVATE_PAT *pGVar5;
  GMM_GFX_TARGET_CACHE GVar6;
  uint32_t PATIdx;
  GMM_GFX_MEMORY_TYPE GVar7;
  uint32_t uVar8;
  undefined8 in_stack_ffffffffffffffc0;
  
  auVar2 = CachePolicy._8_32_;
  CachePolicy_00._32_8_ = in_stack_ffffffffffffffc0;
  CachePolicy_00.IDCode = auVar2._0_4_;
  CachePolicy_00._4_4_ = auVar2._4_4_;
  CachePolicy_00.field_1 = (anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1)auVar2._8_8_;
  CachePolicy_00.MemoryObjectOverride = (MEMORY_OBJECT_CONTROL_STATE)auVar2._16_4_;
  CachePolicy_00.field_3 = (anon_union_4_2_78ef2503_for_GMM_CACHE_POLICY_ELEMENT_REC_4)auVar2._20_4_
  ;
  CachePolicy_00.PTE = (GMM_PTE_CACHE_CONTROL_BITS)auVar2._24_8_;
  WantedMT = GmmCachePolicyCommon::GetWantedMemoryType((GmmCachePolicyCommon *)this,CachePolicy_00);
  GVar6 = (uint)(((undefined1  [40])CachePolicy & (undefined1  [40])0x2) == (undefined1  [40])0x0) *
          3;
  uVar8 = 1;
  if (((undefined1  [40])CachePolicy & (undefined1  [40])0x1) != (undefined1  [40])0x0) {
    GVar6 = GMM_GFX_TC_LLC_ONLY;
  }
  WantedTC = GMM_GFX_TC_ELLC_LLC;
  if ((~CachePolicy.field_1._0_4_ & 3) != 0) {
    WantedTC = GVar6;
  }
  PATIdx = 0;
  while( true ) {
    uVar1 = (this->super_GmmGen9CachePolicy).super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
            NumPATRegisters;
    pGVar5 = GmmGen8CachePolicy::GetPrivatePATEntry((GmmGen8CachePolicy *)this,PATIdx);
    GVar7 = (GMM_GFX_MEMORY_TYPE)pGVar5;
    if (uVar1 <= uVar8) break;
    pGVar5 = GmmGen8CachePolicy::GetPrivatePATEntry((GmmGen8CachePolicy *)this,uVar8);
    bVar4 = GmmGen8CachePolicy::SelectNewPATIdx
                      ((GmmGen8CachePolicy *)this,WantedMT,WantedTC,GVar7 & GMM_GFX_WB,
                       GVar7 >> 2 & GMM_GFX_TC_ELLC_LLC,(GMM_GFX_MEMORY_TYPE)pGVar5 & GMM_GFX_WB,
                       (GMM_GFX_MEMORY_TYPE)pGVar5 >> 2 & GMM_GFX_TC_ELLC_LLC);
    uVar3 = uVar8;
    if (!bVar4) {
      uVar3 = PATIdx;
    }
    PATIdx = uVar3;
    uVar8 = uVar8 + 1;
  }
  uVar8 = 0xffffffff;
  if ((GVar7 & GMM_GFX_WB) == WantedMT) {
    uVar8 = PATIdx;
  }
  return uVar8;
}

Assistant:

uint32_t GmmLib::GmmGen10CachePolicy::BestMatchingPATIdx(GMM_CACHE_POLICY_ELEMENT CachePolicy)
{
    uint32_t             i;
    uint32_t             PATIdx           = 0;
    GMM_GFX_MEMORY_TYPE  WantedMemoryType = GMM_GFX_UC_WITH_FENCE, MemoryType;
    GMM_GFX_TARGET_CACHE WantedTC         = GMM_GFX_TC_ELLC_LLC;

    WantedMemoryType = GetWantedMemoryType(CachePolicy);

    if(CachePolicy.LLC && CachePolicy.ELLC)
    {
        WantedTC = GMM_GFX_TC_ELLC_LLC;
    }
    else if(CachePolicy.LLC)
    {
        WantedTC = GMM_GFX_TC_LLC_ONLY;
    }
    else if(CachePolicy.ELLC)
    {
        WantedTC = GMM_GFX_TC_ELLC_ONLY; // Note: this overrides the MOCS target cache selection.
    }

    for(i = 1; i < NumPATRegisters; i++)
    {
        GMM_PRIVATE_PAT PAT1 = GetPrivatePATEntry(PATIdx);
        GMM_PRIVATE_PAT PAT2 = GetPrivatePATEntry(i);

        if(SelectNewPATIdx(WantedMemoryType, WantedTC,
                           (GMM_GFX_MEMORY_TYPE)PAT1.Gen10.MemoryType, (GMM_GFX_TARGET_CACHE)PAT1.Gen10.TargetCache,
                           (GMM_GFX_MEMORY_TYPE)PAT2.Gen10.MemoryType, (GMM_GFX_TARGET_CACHE)PAT2.Gen10.TargetCache))
        {
            PATIdx = i;
        }
    }

    MemoryType = (GMM_GFX_MEMORY_TYPE)GetPrivatePATEntry(PATIdx).Gen10.MemoryType;

    if(MemoryType != WantedMemoryType)
    {
        // Failed to find a matching PAT entry
        return GMM_PAT_ERROR;
    }
    return PATIdx;
}